

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

bool __thiscall
absl::lts_20240722::str_format_internal::anon_unknown_53::ConvertIntImplInnerSlow
          (anon_unknown_53 *this,IntDigits *as_digits,FormatConversionSpecImpl conv,
          FormatSinkImpl *sink)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 extraout_AL;
  char *pcVar3;
  FormatSinkImpl *this_00;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  ulong n;
  char *pcVar7;
  char *pcVar8;
  ulong n_00;
  ulong uVar9;
  char *pcVar10;
  ulong n_01;
  byte bVar11;
  uint uVar12;
  bool bVar13;
  string_view v;
  string_view v_00;
  string_view sVar14;
  
  this_00 = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000008 >> 0x20),conv.precision_);
  uVar4 = conv._0_4_;
  uVar12 = (uint)as_digits;
  uVar1 = (ulong)as_digits >> 8;
  pcVar8 = (char *)0x0;
  pcVar5 = (char *)((ulong)as_digits >> 0x20);
  if ((long)as_digits < 0) {
    pcVar5 = pcVar8;
  }
  v_00 = IntDigits::without_neg_or_zero((IntDigits *)this);
  pcVar3 = (char *)v_00._M_len;
  pcVar10 = pcVar5 + -(long)pcVar3;
  if (pcVar5 < pcVar3) {
    pcVar10 = pcVar8;
  }
  bVar13 = (uVar12 & 0xfe) == 2;
  pcVar5 = (char *)(ulong)bVar13;
  if ((bVar13) && (pcVar8 = "-", **(char **)this != '-')) {
    if ((uVar1 & 2) == 0) {
      pcVar8 = (char *)0x0;
      if ((uVar1 & 4) != 0) {
        pcVar8 = " ";
      }
      pcVar5 = (char *)(ulong)(((byte)((ulong)as_digits >> 8) & 4) >> 2);
    }
    else {
      pcVar5 = (char *)0x1;
      pcVar8 = "+";
    }
  }
  pcVar7 = (char *)0x0;
  pcVar6 = pcVar10 + -(long)pcVar5;
  if (pcVar10 < pcVar5) {
    pcVar6 = pcVar7;
  }
  bVar11 = (byte)as_digits;
  if (bVar11 < 0x12) {
    pcVar10 = (char *)0x0;
    if ((0x200c0U >> (uVar12 & 0x1f) & 1) != 0) {
      pcVar7 = (char *)0x0;
      pcVar10 = (char *)0x0;
      if ((uVar12 >> 0xb & 1) != 0 || bVar11 == 0x11) {
        sVar14 = IntDigits::without_neg_or_zero((IntDigits *)this);
        if (sVar14._M_len == 0) {
          pcVar7 = (char *)0x0;
          pcVar10 = (char *)0x0;
        }
        else {
          pcVar7 = "0x";
          if (bVar11 == 7) {
            pcVar7 = "0X";
          }
          pcVar10 = (char *)0x2;
        }
      }
    }
  }
  else {
    pcVar10 = (char *)0x0;
  }
  uVar9 = 0;
  if (pcVar10 <= pcVar6) {
    uVar9 = (long)pcVar6 - (long)pcVar10;
  }
  pcVar6 = (char *)0x1;
  if (-1 < (int)uVar4) {
    pcVar6 = (char *)(ulong)uVar4;
  }
  if ((bVar11 == 4 && (uVar1 & 8) != 0) &&
     (((pcVar3 == (char *)0x0 || (*v_00._M_str != '0')) && (pcVar6 < pcVar3 + 1)))) {
    pcVar6 = pcVar3 + 1;
  }
  n_00 = 0;
  n = (long)pcVar6 - (long)pcVar3;
  if (pcVar6 < pcVar3) {
    n = n_00;
  }
  n_01 = uVar9 - n;
  if (uVar9 < n) {
    n_01 = n_00;
  }
  if ((uVar1 & 1) == 0) {
    n_00 = n_01;
  }
  if ((int)uVar4 < 0) {
    uVar9 = n_00;
    uVar2 = 0;
    if ((uVar1 & 0x10) == 0) {
      uVar9 = 0;
      uVar2 = n_00;
    }
    n_00 = uVar2;
    n = n + uVar9;
  }
  if ((uVar1 & 1) == 0) {
    n_01 = 0;
  }
  FormatSinkImpl::Append(this_00,n_00,' ');
  sVar14._M_str = pcVar8;
  sVar14._M_len = (size_t)pcVar5;
  FormatSinkImpl::Append(this_00,sVar14);
  v._M_str = pcVar7;
  v._M_len = (size_t)pcVar10;
  FormatSinkImpl::Append(this_00,v);
  FormatSinkImpl::Append(this_00,n,'0');
  FormatSinkImpl::Append(this_00,v_00);
  FormatSinkImpl::Append(this_00,n_01,' ');
  return (bool)extraout_AL;
}

Assistant:

bool ConvertIntImplInnerSlow(const IntDigits &as_digits,
                             const FormatConversionSpecImpl conv,
                             FormatSinkImpl *sink) {
  // Print as a sequence of Substrings:
  //   [left_spaces][sign][base_indicator][zeroes][formatted][right_spaces]
  size_t fill = 0;
  if (conv.width() >= 0)
    fill = static_cast<size_t>(conv.width());

  string_view formatted = as_digits.without_neg_or_zero();
  ReducePadding(formatted, &fill);

  string_view sign = SignColumn(as_digits.is_negative(), conv);
  ReducePadding(sign, &fill);

  string_view base_indicator = BaseIndicator(as_digits, conv);
  ReducePadding(base_indicator, &fill);

  bool precision_specified = conv.precision() >= 0;
  size_t precision =
      precision_specified ? static_cast<size_t>(conv.precision()) : size_t{1};

  if (conv.has_alt_flag() &&
      conv.conversion_char() == FormatConversionCharInternal::o) {
    // From POSIX description of the '#' (alt) flag:
    //   "For o conversion, it increases the precision (if necessary) to
    //   force the first digit of the result to be zero."
    if (formatted.empty() || *formatted.begin() != '0') {
      size_t needed = formatted.size() + 1;
      precision = std::max(precision, needed);
    }
  }

  size_t num_zeroes = Excess(formatted.size(), precision);
  ReducePadding(num_zeroes, &fill);

  size_t num_left_spaces = !conv.has_left_flag() ? fill : 0;
  size_t num_right_spaces = conv.has_left_flag() ? fill : 0;

  // From POSIX description of the '0' (zero) flag:
  //   "For d, i, o, u, x, and X conversion specifiers, if a precision
  //   is specified, the '0' flag is ignored."
  if (!precision_specified && conv.has_zero_flag()) {
    num_zeroes += num_left_spaces;
    num_left_spaces = 0;
  }

  sink->Append(num_left_spaces, ' ');
  sink->Append(sign);
  sink->Append(base_indicator);
  sink->Append(num_zeroes, '0');
  sink->Append(formatted);
  sink->Append(num_right_spaces, ' ');
  return true;
}